

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

void __thiscall SQFunctionProto::Release(SQFunctionProto *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  SQInteger size;
  SQInteger nl_4;
  SQInteger nl_3;
  SQInteger nl_2;
  SQInteger nl_1;
  SQInteger nl;
  SQFunctionProto *this_local;
  
  for (nl_1 = 0; nl_1 < this->_nliterals; nl_1 = nl_1 + 1) {
    ::SQObjectPtr::~SQObjectPtr(this->_literals + nl_1);
  }
  for (nl_2 = 0; nl_2 < this->_nparameters; nl_2 = nl_2 + 1) {
    ::SQObjectPtr::~SQObjectPtr(this->_parameters + nl_2);
  }
  for (nl_3 = 0; nl_3 < this->_nfunctions; nl_3 = nl_3 + 1) {
    ::SQObjectPtr::~SQObjectPtr(this->_functions + nl_3);
  }
  for (nl_4 = 0; nl_4 < this->_noutervalues; nl_4 = nl_4 + 1) {
    SQOuterVar::~SQOuterVar(this->_outervalues + nl_4);
  }
  for (size = 0; size < this->_nlocalvarinfos; size = size + 1) {
    SQLocalVarInfo::~SQLocalVarInfo(this->_localvarinfos + size);
  }
  lVar1 = this->_ninstructions;
  lVar2 = this->_nliterals;
  lVar3 = this->_nparameters;
  lVar4 = this->_nfunctions;
  lVar5 = this->_noutervalues;
  lVar6 = this->_nlineinfos;
  lVar7 = this->_nlocalvarinfos;
  lVar8 = this->_ndefaultparams;
  (**(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)();
  sq_vm_free(this,(lVar1 + -1) * 8 + 0xe8 + lVar2 * 0x10 + lVar3 * 0x10 + lVar4 * 0x10 +
                  lVar5 * 0x28 + lVar6 * 0x10 + lVar7 * 0x28 + lVar8 * 8);
  return;
}

Assistant:

void Release(){
        _DESTRUCT_VECTOR(SQObjectPtr,_nliterals,_literals);
        _DESTRUCT_VECTOR(SQObjectPtr,_nparameters,_parameters);
        _DESTRUCT_VECTOR(SQObjectPtr,_nfunctions,_functions);
        _DESTRUCT_VECTOR(SQOuterVar,_noutervalues,_outervalues);
        //_DESTRUCT_VECTOR(SQLineInfo,_nlineinfos,_lineinfos); //not required are 2 integers
        _DESTRUCT_VECTOR(SQLocalVarInfo,_nlocalvarinfos,_localvarinfos);
        SQInteger size = _FUNC_SIZE(_ninstructions,_nliterals,_nparameters,_nfunctions,_noutervalues,_nlineinfos,_nlocalvarinfos,_ndefaultparams);
        this->~SQFunctionProto();
        sq_vm_free(this,size);
    }